

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

void __thiscall
slang::ast::SFormat::TypeVisitor::formatArray<slang::SVQueue>
          (TypeVisitor *this,Type *type,SVQueue *arr)

{
  FormatBuffer *this_00;
  Type *this_01;
  size_type sVar1;
  reference args;
  size_t i;
  ulong __n;
  
  this_01 = Type::getArrayElementType(type);
  this_00 = &this->buffer;
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,"\'{","");
  __n = 0;
  while( true ) {
    sVar1 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                      (&arr->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
    if (sVar1 <= __n) break;
    if (__n != 0) {
      ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,",","");
      if (this->abbreviated == false) {
        ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00," ","");
      }
    }
    args = std::
           _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>::
           operator[](&(arr->
                       super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                       ._M_impl.super__Deque_impl_data._M_start,__n);
    Symbol::visit<slang::ast::SFormat::TypeVisitor&,slang::ConstantValue_const&>
              (&this_01->super_Symbol,this,args);
    __n = __n + 1;
  }
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,"}","");
  return;
}

Assistant:

void formatArray(const Type& type, const T& arr) {
        auto elemType = type.getArrayElementType();
        SLANG_ASSERT(elemType);

        buffer.append("'{");
        for (size_t i = 0; i < arr.size(); i++) {
            if (i != 0) {
                buffer.append(",");
                if (!abbreviated)
                    buffer.append(" ");
            }
            elemType->visit(*this, arr[i]);
        }
        buffer.append("}");
    }